

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_astar_open_list.hpp
# Opt level: O2

void __thiscall
external_astar::ExternalAstarOpenList<Node<Tiles>_>::ExternalAstarOpenList
          (ExternalAstarOpenList<Node<Tiles>_> *this)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->fg_buckets)._M_t._M_impl.super__Rb_tree_header;
  (this->fg_buckets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fg_buckets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fg_buckets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fg_buckets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->fg_buckets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->current_fg).first = 0;
  (this->current_fg).second = 0;
  this->first_insert = true;
  mkdir("open_list_buckets",0x1e4);
  dfpair(_stdout,"merge chunk (bytes)","%lu",MERGE_CHUNK_BYTES);
  return;
}

Assistant:

ExternalAstarOpenList<Entry>::ExternalAstarOpenList()
    {
        // create directory for open list files if not exist
        mkdir("open_list_buckets", 0744);
        dfpair(stdout, "merge chunk (bytes)", "%lu", MERGE_CHUNK_BYTES);
    }